

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageLoader.c
# Opt level: O0

uint8_t * LoadImage(char *imagePath)

{
  stbi_uc *__src;
  int *in_RDI;
  uint8_t *image;
  uint8_t *imageBuffer;
  int channels;
  int height;
  int width;
  undefined8 in_stack_ffffffffffffffd8;
  int req_comp;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  uint in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff8;
  uint8_t *__dest;
  
  req_comp = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  stbi_set_flip_vertically_on_load(1);
  __src = stbi_load(in_stack_fffffffffffffff8,in_RDI,
                    (int *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                    (int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),req_comp);
  if (__src == (stbi_uc *)0x0) {
    fprintf(_stderr,"Can\'t load image!\n");
    __dest = (uint8_t *)0x0;
  }
  else {
    __dest = (uint8_t *)
             malloc((long)(int)in_stack_ffffffffffffffec * (long)(int)in_stack_ffffffffffffffe8 *
                    (long)(int)in_stack_ffffffffffffffe4);
    memcpy(__dest,__src,
           (long)(int)in_stack_ffffffffffffffec * (long)(int)in_stack_ffffffffffffffe8 *
           (long)(int)in_stack_ffffffffffffffe4);
    printf("Loaded image %s successfully!\nWidth: %d Height: %d Channels %d\n",in_RDI,
           (ulong)in_stack_ffffffffffffffec,(ulong)in_stack_ffffffffffffffe8,
           (ulong)in_stack_ffffffffffffffe4);
    FreeImage((uint8_t *)0x15d80b);
  }
  return __dest;
}

Assistant:

uint8_t * LoadImage(const char * imagePath) {
    stbi_set_flip_vertically_on_load(1);
    int width, height, channels;
    uint8_t * imageBuffer = stbi_load(imagePath, &width, &height, &channels, 0);
    if (imageBuffer == NULL) {
        fprintf(stderr, "Can't load image!\n");
        return NULL;
    }
    uint8_t * image = malloc(sizeof(uint8_t) * width * height * channels);
    memcpy(image, imageBuffer, sizeof(uint8_t) * width * height * channels);
    printf("Loaded image %s successfully!\nWidth: %d Height: %d Channels %d\n", imagePath, width, height, channels);
    FreeImage(imageBuffer);
    return image;
}